

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void WM_FreePatches(void)

{
  _sample *p_Var1;
  _patch *p_Var2;
  _sample *tmp_sample;
  _patch *tmp_patch;
  int i;
  
  FCriticalSection::Enter(&patch_lock);
  for (tmp_patch._4_4_ = 0; tmp_patch._4_4_ < 0x80; tmp_patch._4_4_ = tmp_patch._4_4_ + 1) {
    while (patch[tmp_patch._4_4_] != (_patch *)0x0) {
      while (patch[tmp_patch._4_4_]->first_sample != (_sample *)0x0) {
        p_Var1 = patch[tmp_patch._4_4_]->first_sample->next;
        free(patch[tmp_patch._4_4_]->first_sample->data);
        free(patch[tmp_patch._4_4_]->first_sample);
        patch[tmp_patch._4_4_]->first_sample = p_Var1;
      }
      free(patch[tmp_patch._4_4_]->filename);
      p_Var2 = patch[tmp_patch._4_4_]->next;
      free(patch[tmp_patch._4_4_]);
      patch[tmp_patch._4_4_] = p_Var2;
    }
  }
  FCriticalSection::Leave(&patch_lock);
  return;
}

Assistant:

static void WM_FreePatches(void) {
	int i;
	struct _patch * tmp_patch;
	struct _sample * tmp_sample;

	patch_lock.Enter();
	for (i = 0; i < 128; i++) {
		while (patch[i]) {
			while (patch[i]->first_sample) {
				tmp_sample = patch[i]->first_sample->next;
				free(patch[i]->first_sample->data);
				free(patch[i]->first_sample);
				patch[i]->first_sample = tmp_sample;
			}
			free(patch[i]->filename);
			tmp_patch = patch[i]->next;
			free(patch[i]);
			patch[i] = tmp_patch;
		}
	}
	patch_lock.Leave();
}